

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char cVar1;
  long lVar2;
  char cVar3;
  uint size;
  uint uVar4;
  type tVar5;
  char *pcVar6;
  buffer_appender<char> bVar7;
  int iVar8;
  size_t size_00;
  int iVar9;
  pointer pcVar10;
  undefined1 auVar11 [8];
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  undefined1 local_2a0 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  anon_class_16_2_3f014a30 local_58;
  undefined1 local_48 [8];
  string groups;
  
  grouping_impl<char>((string *)local_48,(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
  }
  else {
    cVar3 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar3 != '\0') {
      size = count_digits(this->abs_value);
      uVar14 = (ulong)size;
      iVar8 = (int)groups._M_dataplus._M_p + size;
      pcVar10 = (pointer)0x0;
      uVar4 = size;
      do {
        if (groups._M_dataplus._M_p == pcVar10) {
LAB_0021486b:
          iVar8 = (int)(uVar4 - 1) /
                  (int)((char *)((long)local_48 + -1))[(long)groups._M_dataplus._M_p] + iVar8;
LAB_0021487b:
          format_decimal<char,unsigned_long>(buffer.store_ + 0x1f0,this->abs_value,size);
          buffer.super_buffer<char>._vptr_buffer =
               (_func_int **)&buffer.super_buffer<char>.capacity_;
          buffer.super_buffer<char>.ptr_ = (char *)0x0;
          local_2a0 = (undefined1  [8])&PTR_grow_002b5bf8;
          buffer.super_buffer<char>.size_ = 500;
          iVar8 = iVar8 + this->prefix_size;
          tVar5 = to_unsigned<int>(iVar8);
          buffer<char>::try_resize((buffer<char> *)local_2a0,(ulong)tVar5);
          size_00 = (size_t)iVar8;
          iVar9 = 0;
          pcVar6 = (char *)((long)buffer.super_buffer<char>._vptr_buffer + size_00);
          auVar11 = local_48;
          do {
            pcVar13 = pcVar6 + -1;
            do {
              pcVar6 = pcVar13;
              if ((int)uVar14 < 1) {
                if (this->prefix_size != 0) {
                  *pcVar6 = '-';
                }
                local_58.data = (char *)buffer.super_buffer<char>._vptr_buffer;
                local_58.size = iVar8;
                bVar7 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                                  ((buffer_appender<char>)
                                   (this->out).
                                   super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                   container,this->specs,size_00,size_00,&local_58);
                (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                     (buffer<char> *)
                     bVar7.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
                basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                          ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2a0);
                goto LAB_00214976;
              }
              lVar2 = uVar14 - 9;
              uVar14 = uVar14 - 1;
              *pcVar6 = digits[lVar2];
              cVar1 = *(char *)auVar11;
              pcVar13 = pcVar6 + -1;
            } while (cVar1 < '\x01');
            iVar9 = iVar9 + 1;
            if ((cVar1 != '\x7f') && (iVar9 % (int)cVar1 == 0)) {
              if ((char *)((long)auVar11 + 1) !=
                  (char *)((long)local_48 + (long)groups._M_dataplus._M_p)) {
                iVar9 = 0;
                auVar11 = (undefined1  [8])((long)auVar11 + 1);
              }
              *pcVar13 = cVar3;
              pcVar6 = pcVar13;
            }
          } while( true );
        }
        cVar1 = *(char *)((long)local_48 + (long)pcVar10);
        uVar12 = uVar4 - (int)cVar1;
        if ((uVar12 == 0 || (int)uVar4 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          iVar8 = size + (int)pcVar10;
          if (groups._M_dataplus._M_p != pcVar10) goto LAB_0021487b;
          goto LAB_0021486b;
        }
        pcVar10 = pcVar10 + 1;
        uVar4 = uVar12;
      } while( true );
    }
    on_dec(this);
  }
LAB_00214976:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }